

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moves.cpp
# Opt level: O0

int __thiscall linkedMoveList::remove(linkedMoveList *this,char *__filename)

{
  int iVar1;
  moveNode *extraout_RAX;
  moveNode *extraout_RAX_00;
  int local_34;
  moveNode *pmStack_30;
  int i;
  moveNode *previous;
  moveNode *current;
  moveNode *temp;
  int pos_local;
  linkedMoveList *this_local;
  moveNode *pmVar2;
  
  if ((int)__filename == 0) {
    pmVar2 = this->head;
    this->head = this->head->next;
    if (pmVar2 != (moveNode *)0x0) {
      operator_delete(pmVar2,0x10);
      pmVar2 = extraout_RAX;
    }
    iVar1 = (int)pmVar2;
  }
  else {
    previous = this->head->next;
    pmStack_30 = this->head;
    for (local_34 = 1; local_34 < (int)__filename; local_34 = local_34 + 1) {
      pmStack_30 = previous;
      previous = previous->next;
    }
    pmStack_30->next = previous->next;
    if (previous == this->tail) {
      this->tail = pmStack_30;
    }
    if (previous != (moveNode *)0x0) {
      operator_delete(previous,0x10);
      previous = extraout_RAX_00;
    }
    iVar1 = (int)previous;
  }
  return iVar1;
}

Assistant:

void linkedMoveList::remove(int pos){
	if(pos == 0) {
		moveNode *temp = head;
		head = head->next;
		delete temp;
	} else {
		moveNode *current = head->next;
		moveNode *previous = head;
		for(int i = 1; i < pos; i++){
			previous = current;
			current = current->next;
		}
		previous->next = current->next;
		if(current == tail) tail = previous;
		delete current;
	}
}